

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O2

void __thiscall Fl_Widget_Type::Fl_Widget_Type(Fl_Widget_Type *this)

{
  int n;
  long lVar1;
  
  Fl_Type::Fl_Type(&this->super_Fl_Type);
  (this->super_Fl_Type)._vptr_Fl_Type = (_func_int **)&PTR_setlabel_00272db0;
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    this->extra_code_[lVar1] = (char *)0x0;
  }
  this->image_name_ = (char *)0x0;
  this->inactive_name_ = (char *)0x0;
  this->subclass_ = (char *)0x0;
  this->tooltip_ = (char *)0x0;
  this->hotspot_ = '\0';
  this->xclass = (char *)0x0;
  this->o = (Fl_Widget *)0x0;
  this->image = (Fluid_Image *)0x0;
  this->inactive = (Fluid_Image *)0x0;
  this->public_ = 1;
  return;
}

Assistant:

Fl_Widget_Type::Fl_Widget_Type() {
  for (int n=0; n<NUM_EXTRA_CODE; n++) {extra_code_[n] = 0; }
  subclass_ = 0;
  hotspot_ = 0;
  tooltip_ = 0;
  image_name_ = 0;
  inactive_name_ = 0;
  image = 0;
  inactive = 0;
  xclass = 0;
  o = 0;
  public_ = 1;
}